

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

float CombinedShannonEntropy_C(int *X,int *Y)

{
  float fVar1;
  long in_RSI;
  long in_RDI;
  float fVar2;
  float fVar3;
  int xy;
  int x;
  int sumXY;
  int sumX;
  double retval;
  int i;
  undefined4 local_14;
  
  fVar1 = 0.0;
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    if (*(int *)(in_RDI + (long)local_14 * 4) == 0) {
      if (*(int *)(in_RSI + (long)local_14 * 4) != 0) {
        fVar2 = VP8LFastSLog2(0);
        fVar1 = fVar1 - fVar2;
      }
    }
    else {
      fVar2 = VP8LFastSLog2(0);
      fVar3 = VP8LFastSLog2(0);
      fVar1 = (fVar1 - fVar2) - fVar3;
    }
  }
  fVar2 = VP8LFastSLog2(0);
  fVar3 = VP8LFastSLog2(0);
  return fVar2 + fVar3 + fVar1;
}

Assistant:

static float CombinedShannonEntropy_C(const int X[256], const int Y[256]) {
  int i;
  double retval = 0.;
  int sumX = 0, sumXY = 0;
  for (i = 0; i < 256; ++i) {
    const int x = X[i];
    if (x != 0) {
      const int xy = x + Y[i];
      sumX += x;
      retval -= VP8LFastSLog2(x);
      sumXY += xy;
      retval -= VP8LFastSLog2(xy);
    } else if (Y[i] != 0) {
      sumXY += Y[i];
      retval -= VP8LFastSLog2(Y[i]);
    }
  }
  retval += VP8LFastSLog2(sumX) + VP8LFastSLog2(sumXY);
  return (float)retval;
}